

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# date_part.cpp
# Opt level: O3

ScalarFunction *
duckdb::StructDatePart::GetFunction<duckdb::dtime_tz_t>
          (ScalarFunction *__return_storage_ptr__,LogicalType *temporal_type)

{
  LogicalType varargs;
  long lVar1;
  initializer_list<duckdb::LogicalType> __l;
  LogicalType result_type;
  LogicalType part_type;
  undefined4 in_stack_fffffffffffffed4;
  undefined4 in_stack_fffffffffffffedc;
  FunctionNullHandling in_stack_fffffffffffffee8;
  bind_lambda_function_t in_stack_fffffffffffffef0;
  scalar_function_t local_108;
  LogicalType local_e8 [3];
  vector<duckdb::LogicalType,_true> local_a0;
  LogicalType local_88;
  LogicalType local_70;
  child_list_t<LogicalType> local_58;
  LogicalType local_38;
  
  LogicalType::LogicalType(local_e8,VARCHAR);
  LogicalType::LIST(&local_70,local_e8);
  LogicalType::~LogicalType(local_e8);
  local_58.
  super_vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
  .
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_58.
  super_vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
  .
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_58.
  super_vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
  .
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  LogicalType::STRUCT(&local_88,&local_58);
  ::std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
  ::~vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
             *)&local_58);
  LogicalType::LogicalType(local_e8,&local_70);
  LogicalType::LogicalType(local_e8 + 1,temporal_type);
  __l._M_len = 2;
  __l._M_array = local_e8;
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::vector
            ((vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> *)&local_a0,__l,
             (allocator_type *)&stack0xfffffffffffffef7);
  LogicalType::LogicalType(local_e8 + 2,&local_88);
  local_108.super__Function_base._M_functor._8_8_ = 0;
  local_108.super__Function_base._M_functor._M_unused._M_function_pointer =
       Function<duckdb::dtime_tz_t>;
  local_108._M_invoker =
       ::std::
       _Function_handler<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&),_void_(*)(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>
       ::_M_invoke;
  local_108.super__Function_base._M_manager =
       ::std::
       _Function_handler<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&),_void_(*)(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>
       ::_M_manager;
  LogicalType::LogicalType(&local_38,INVALID);
  varargs.type_info_.internal.super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr._0_4_ = 0;
  varargs._0_8_ = &local_38;
  varargs.type_info_.internal.super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr._4_4_ = in_stack_fffffffffffffed4;
  varargs.type_info_.internal.super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi._0_4_ = 0;
  varargs.type_info_.internal.super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi._4_4_ = in_stack_fffffffffffffedc;
  ScalarFunction::ScalarFunction
            (__return_storage_ptr__,&local_a0,local_e8 + 2,&local_108,Bind,
             (bind_scalar_function_extended_t)0x0,(function_statistics_t)0x0,(init_local_state_t)0x0
             ,varargs,CONSISTENT,in_stack_fffffffffffffee8,in_stack_fffffffffffffef0);
  LogicalType::~LogicalType(&local_38);
  if (local_108.super__Function_base._M_manager != (_Manager_type)0x0) {
    (*local_108.super__Function_base._M_manager)
              ((_Any_data *)&local_108,(_Any_data *)&local_108,__destroy_functor);
  }
  LogicalType::~LogicalType(local_e8 + 2);
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector
            ((vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> *)&local_a0);
  lVar1 = 0x18;
  do {
    LogicalType::~LogicalType((LogicalType *)(&local_e8[0].id_ + lVar1));
    lVar1 = lVar1 + -0x18;
  } while (lVar1 != -0x18);
  __return_storage_ptr__->serialize = SerializeFunction;
  __return_storage_ptr__->deserialize = DeserializeFunction;
  LogicalType::~LogicalType(&local_88);
  LogicalType::~LogicalType(&local_70);
  return __return_storage_ptr__;
}

Assistant:

static ScalarFunction GetFunction(const LogicalType &temporal_type) {
		auto part_type = LogicalType::LIST(LogicalType::VARCHAR);
		auto result_type = LogicalType::STRUCT({});
		ScalarFunction result({part_type, temporal_type}, result_type, Function<INPUT_TYPE>, Bind);
		result.serialize = SerializeFunction;
		result.deserialize = DeserializeFunction;
		return result;
	}